

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

void box_printf(char *fmt,...)

{
  size_t sVar1;
  ostream *poVar2;
  int local_d0;
  int i;
  int len;
  char buffer [160];
  va_list marker;
  char *fmt_local;
  
  memset(&i,0,0xa0);
  std::operator<<((ostream *)&std::cerr,anon_var_dwarf_2c537);
  buffer[0x9c] = '0';
  buffer[0x9d] = '\0';
  buffer[0x9e] = '\0';
  buffer[0x9f] = '\0';
  buffer[0x98] = '\b';
  buffer[0x99] = '\0';
  buffer[0x9a] = '\0';
  buffer[0x9b] = '\0';
  vsprintf((char *)&i,fmt,buffer + 0x98);
  sVar1 = strlen((char *)&i);
  for (local_d0 = (int)sVar1; local_d0 < 0x49; local_d0 = local_d0 + 1) {
    *(undefined1 *)((long)&i + (long)local_d0) = 0x20;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,(char *)&i);
  std::operator<<(poVar2,anon_var_dwarf_2c54d);
  return;
}

Assistant:

void box_printf(char const* fmt, ...)
{
    va_list marker;
    char buffer[160]{0};
    int len, i;

    std::cerr << "║ ";

    va_start(marker,fmt);
    vsprintf(buffer,fmt,marker);
    va_end(marker);
    len = strlen(buffer);

    for( i = len; i < 73; i++ )
       buffer[i] = ' ';

    std::cerr << buffer << "║\n";
}